

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O2

void DecodeAperiodicity(double **coded_aperiodicity,int f0_length,int fs,int fft_size,
                       double **aperiodicity)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  double *xi;
  double *x;
  double *y;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int i_2;
  uint xi_length;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  iVar3 = fft_size / 2;
  iVar2 = -1;
  if (-1 < iVar3) {
    iVar2 = iVar3;
  }
  uVar7 = 0;
  uVar9 = (ulong)(uint)f0_length;
  if (f0_length < 1) {
    uVar9 = uVar7;
  }
  for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
    for (uVar10 = 0; iVar2 + 1 != uVar10; uVar10 = uVar10 + 1) {
      aperiodicity[uVar7][uVar10] = 0.999999999999;
    }
  }
  dVar14 = (double)fs * 0.5;
  dVar12 = dVar14 + -3000.0;
  dVar13 = 15000.0;
  if (dVar12 <= 15000.0) {
    dVar13 = dVar12;
  }
  xi_length = iVar3 + 1;
  uVar7 = (long)iVar3 * 8 + 8;
  if (fft_size < -3) {
    uVar7 = 0xffffffffffffffff;
  }
  xi = (double *)operator_new__(uVar7);
  uVar7 = 0;
  uVar10 = 0;
  if (0 < (int)xi_length) {
    uVar10 = (ulong)xi_length;
  }
  for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
    xi[uVar7] = (double)(int)uVar7 * ((double)fs / (double)fft_size);
  }
  uVar4 = (uint)(dVar13 / 3000.0);
  lVar11 = (long)(int)uVar4;
  uVar7 = lVar11 * 8 + 0x10;
  if ((int)uVar4 < -2) {
    uVar7 = 0xffffffffffffffff;
  }
  x = (double *)operator_new__(uVar7);
  for (lVar5 = 0; lVar5 <= lVar11; lVar5 = lVar5 + 1) {
    x[lVar5] = (double)(int)lVar5 * 3000.0;
  }
  x[lVar11 + 1] = dVar14;
  y = (double *)operator_new__(uVar7);
  *y = -60.0;
  uVar7 = 0;
  uVar8 = 0;
  if (0 < (int)uVar4) {
    uVar8 = (ulong)uVar4;
  }
  y[lVar11 + 1] = -1e-12;
  for (; uVar7 != uVar9; uVar7 = uVar7 + 1) {
    pdVar1 = coded_aperiodicity[uVar7];
    dVar13 = 0.0;
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      dVar13 = dVar13 + pdVar1[uVar6];
      y[uVar6 + 1] = pdVar1[uVar6];
    }
    if (dVar13 / (double)(int)uVar4 <= -0.5) {
      pdVar1 = aperiodicity[uVar7];
      interp1(x,y,uVar4 + 2,xi,xi_length,pdVar1);
      for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
        dVar13 = pow(10.0,pdVar1[uVar6] / 20.0);
        pdVar1[uVar6] = dVar13;
      }
    }
  }
  operator_delete__(y);
  operator_delete__(x);
  operator_delete__(xi);
  return;
}

Assistant:

void DecodeAperiodicity(const double * const *coded_aperiodicity,
    int f0_length, int fs, int fft_size, double **aperiodicity) {
  InitializeAperiodicity(f0_length, fft_size, aperiodicity);
  int number_of_aperiodicities = GetNumberOfAperiodicities(fs);
  double *frequency_axis = new double[fft_size / 2 + 1];
  for (int i = 0; i <= fft_size / 2; ++i)
    frequency_axis[i] = static_cast<double>(fs) / fft_size * i;

  double *coarse_frequency_axis = new double[number_of_aperiodicities + 2];
  for (int i = 0; i <= number_of_aperiodicities; ++i)
    coarse_frequency_axis[i] = i * world::kFrequencyInterval;
  coarse_frequency_axis[number_of_aperiodicities + 1] = fs / 2.0;

  double *coarse_aperiodicity = new double[number_of_aperiodicities + 2];
  coarse_aperiodicity[0] = -60.0;
  coarse_aperiodicity[number_of_aperiodicities + 1] =
    -world::kMySafeGuardMinimum;

  for (int i = 0; i < f0_length; ++i) {
    if (CheckVUV(coded_aperiodicity[i], number_of_aperiodicities,
      coarse_aperiodicity) == 1) continue;
    GetAperiodicity(coarse_frequency_axis, coarse_aperiodicity,
        number_of_aperiodicities, frequency_axis, fft_size, aperiodicity[i]);
  }

  delete[] coarse_aperiodicity;
  delete[] coarse_frequency_axis;
  delete[] frequency_axis;
}